

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_2,_0>::calcEdgeLogLikelihoods
          (BeagleCPU4StateImpl<double,_2,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double sum13;
  double sum12;
  double sum11;
  double sum10;
  double p13;
  double p12;
  double p11;
  double p10;
  double *partials1;
  int k_1;
  double m133;
  double m132;
  double m131;
  double m130;
  double m123;
  double m122;
  double m121;
  double m120;
  double m113;
  double m112;
  double m111;
  double m110;
  double m103;
  double m102;
  double m101;
  double m100;
  double weight_1;
  int v_1;
  int u_1;
  int l_1;
  int w_1;
  double *partialsChild;
  int stateChild;
  int k;
  double weight;
  int u;
  int l;
  int w;
  int v;
  int *statesChild;
  double *wt;
  double *transMatrix;
  double *partialsParent;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  ulong in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff08;
  BeagleCPU4StateImpl<double,_2,_0> *in_stack_ffffffffffffff10;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_5c;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  
  lVar19 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_ESI * 8);
  lVar20 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)in_ECX * 8);
  lVar21 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)in_R8D * 8);
  memset(*(void **)(in_RDI + 0xe0),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 3)
  ;
  if ((in_EDX < *(int *)(in_RDI + 0x10)) &&
     (*(long *)(*(long *)(in_RDI + 0xb8) + (long)in_EDX * 8) != 0)) {
    lVar22 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)in_EDX * 8);
    local_44 = 0;
    local_48 = 0;
    for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x34); local_4c = local_4c + 1) {
      local_50 = 0;
      uVar1 = *(ulong *)(lVar21 + (long)local_4c * 8);
      for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x14); local_5c = local_5c + 1) {
        iVar23 = *(int *)(lVar22 + (long)local_5c * 4);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar1;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_50 * 8);
        auVar44._8_8_ = 0;
        auVar44._0_8_ =
             *(double *)(lVar20 + (long)(local_48 + iVar23) * 8) *
             *(double *)(lVar19 + (long)local_44 * 8);
        auVar28 = vfmadd213sd_fma(auVar24,auVar44,auVar60);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_50 * 8) = auVar28._0_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar1;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_50 + 1) * 8);
        auVar45._8_8_ = 0;
        auVar45._0_8_ =
             *(double *)(lVar20 + (long)(local_48 + 6 + iVar23) * 8) *
             *(double *)(lVar19 + (long)(local_44 + 1) * 8);
        auVar28 = vfmadd213sd_fma(auVar25,auVar45,auVar61);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_50 + 1) * 8) = auVar28._0_8_;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar1;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_50 + 2) * 8);
        auVar46._8_8_ = 0;
        auVar46._0_8_ =
             *(double *)(lVar20 + (long)(local_48 + 0xc + iVar23) * 8) *
             *(double *)(lVar19 + (long)(local_44 + 2) * 8);
        auVar28 = vfmadd213sd_fma(auVar26,auVar46,auVar62);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_50 + 2) * 8) = auVar28._0_8_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar1;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_50 + 3) * 8);
        auVar47._8_8_ = 0;
        auVar47._0_8_ =
             *(double *)(lVar20 + (long)(local_48 + 0x12 + iVar23) * 8) *
             *(double *)(lVar19 + (long)(local_44 + 3) * 8);
        auVar28 = vfmadd213sd_fma(auVar27,auVar47,auVar63);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_50 + 3) * 8) = auVar28._0_8_;
        local_50 = local_50 + 4;
        local_44 = local_44 + 4;
      }
      local_48 = local_48 + 0x18;
      if (*(int *)(in_RDI + 0x1c) != 0) {
        local_44 = *(int *)(in_RDI + 0x1c) * 4 + local_44;
      }
    }
  }
  else {
    lVar22 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8);
    local_6c = 0;
    for (local_70 = 0; local_70 < *(int *)(in_RDI + 0x34); local_70 = local_70 + 1) {
      local_74 = 0;
      local_78 = local_70 * *(int *)(in_RDI + 0x18) * 4;
      uVar1 = *(ulong *)(lVar21 + (long)local_70 * 8);
      uVar2 = *(ulong *)(lVar20 + (long)local_6c * 8);
      dVar3 = *(double *)(lVar20 + (long)(local_6c + 1) * 8);
      uVar4 = *(ulong *)(lVar20 + (long)(local_6c + 2) * 8);
      uVar5 = *(ulong *)(lVar20 + (long)(local_6c + 3) * 8);
      uVar6 = *(ulong *)(lVar20 + (long)(local_6c + 6) * 8);
      dVar7 = *(double *)(lVar20 + (long)(local_6c + 7) * 8);
      uVar8 = *(ulong *)(lVar20 + (long)(local_6c + 8) * 8);
      uVar9 = *(ulong *)(lVar20 + (long)(local_6c + 9) * 8);
      uVar10 = *(ulong *)(lVar20 + (long)(local_6c + 0xc) * 8);
      dVar11 = *(double *)(lVar20 + (long)(local_6c + 0xd) * 8);
      uVar12 = *(ulong *)(lVar20 + (long)(local_6c + 0xe) * 8);
      uVar13 = *(ulong *)(lVar20 + (long)(local_6c + 0xf) * 8);
      uVar14 = *(ulong *)(lVar20 + (long)(local_6c + 0x12) * 8);
      in_stack_ffffffffffffff10 =
           *(BeagleCPU4StateImpl<double,_2,_0> **)(lVar20 + (long)(local_6c + 0x13) * 8);
      in_stack_ffffffffffffff08 = *(double **)(lVar20 + (long)(local_6c + 0x14) * 8);
      in_stack_ffffffffffffff00 = *(ulong *)(lVar20 + (long)(local_6c + 0x15) * 8);
      for (in_stack_fffffffffffffefc = 0; in_stack_fffffffffffffefc < *(int *)(in_RDI + 0x14);
          in_stack_fffffffffffffefc = in_stack_fffffffffffffefc + 1) {
        uVar15 = *(ulong *)(lVar22 + (long)local_78 * 8);
        dVar16 = *(double *)(lVar22 + (long)(local_78 + 1) * 8);
        uVar17 = *(ulong *)(lVar22 + (long)(local_78 + 2) * 8);
        uVar18 = *(ulong *)(lVar22 + (long)(local_78 + 3) * 8);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar2;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = uVar15;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = dVar3 * dVar16;
        auVar28 = vfmadd213sd_fma(auVar48,auVar28,auVar64);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar4;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar17;
        auVar28 = vfmadd213sd_fma(auVar65,auVar29,auVar28);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar5;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar18;
        auVar28 = vfmadd213sd_fma(auVar30,auVar49,auVar28);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar6;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar15;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = dVar7 * dVar16;
        auVar29 = vfmadd213sd_fma(auVar50,auVar31,auVar66);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar8;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = uVar17;
        auVar29 = vfmadd213sd_fma(auVar67,auVar32,auVar29);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar9;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar18;
        auVar29 = vfmadd213sd_fma(auVar33,auVar51,auVar29);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar10;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = uVar15;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = dVar11 * dVar16;
        auVar30 = vfmadd213sd_fma(auVar52,auVar34,auVar68);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar12;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar17;
        auVar30 = vfmadd213sd_fma(auVar69,auVar35,auVar30);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar13;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar18;
        auVar30 = vfmadd213sd_fma(auVar36,auVar53,auVar30);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar14;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar15;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = (double)in_stack_ffffffffffffff10 * dVar16;
        auVar31 = vfmadd213sd_fma(auVar54,auVar37,auVar70);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = in_stack_ffffffffffffff08;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar17;
        auVar31 = vfmadd213sd_fma(auVar71,auVar38,auVar31);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = in_stack_ffffffffffffff00;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar18;
        auVar31 = vfmadd213sd_fma(auVar39,auVar55,auVar31);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar1;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_74 * 8);
        auVar56._8_8_ = 0;
        auVar56._0_8_ = auVar28._0_8_ * *(double *)(lVar19 + (long)local_78 * 8);
        auVar28 = vfmadd213sd_fma(auVar40,auVar56,auVar72);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_74 * 8) = auVar28._0_8_;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar1;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_74 + 1) * 8);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = auVar29._0_8_ * *(double *)(lVar19 + (long)(local_78 + 1) * 8);
        auVar28 = vfmadd213sd_fma(auVar41,auVar57,auVar73);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_74 + 1) * 8) = auVar28._0_8_;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar1;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_74 + 2) * 8);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = auVar30._0_8_ * *(double *)(lVar19 + (long)(local_78 + 2) * 8);
        auVar28 = vfmadd213sd_fma(auVar42,auVar58,auVar74);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_74 + 2) * 8) = auVar28._0_8_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar1;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)(local_74 + 3) * 8);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = auVar31._0_8_ * *(double *)(lVar19 + (long)(local_78 + 3) * 8);
        auVar28 = vfmadd213sd_fma(auVar43,auVar59,auVar75);
        *(long *)(*(long *)(in_RDI + 0xe0) + (long)(local_74 + 3) * 8) = auVar28._0_8_;
        local_74 = local_74 + 4;
        local_78 = local_78 + 4;
      }
      local_6c = local_6c + 0x18;
    }
  }
  iVar23 = integrateOutStatesAndScale
                     (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                      (int)(in_stack_ffffffffffffff00 >> 0x20),(int)in_stack_ffffffffffffff00,
                      (double *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  return iVar23;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
    // TODO: implement derivatives for calculateEdgeLnL

    assert(parIndex >= kTipCount);

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];

                integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
		#if 0//
        int v = 0;
		#endif
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
			#if 1//
			int v = l*kPaddedPatternCount*4;
			#endif
            const REALTYPE weight = wt[l];

            PREFETCH_MATRIX(1,transMatrix,w);

            for(int k = 0; k < kPatternCount; k++) {

                const REALTYPE* partials1 = partialsChild;

                PREFETCH_PARTIALS(1,partials1,v);

                DO_INTEGRATION(1);

                integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
			#if 0//
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
			#endif//
        }
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}